

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Frame.cpp
# Opt level: O2

ssize_t __thiscall ezc3d::DataNS::Frame::write(Frame *this,int __fd,void *__buf,size_t __n)

{
  Points *this_00;
  Analogs *this_01;
  ssize_t extraout_RAX;
  ssize_t sVar1;
  runtime_error *this_02;
  size_t __n_00;
  int in_R8D;
  _Vector_base<double,_std::allocator<double>_> _Stack_58;
  _Vector_base<double,_std::allocator<double>_> local_40;
  
  if (in_R8D == 1) {
    sVar1 = RotationNS::Rotations::write
                      ((this->_rotations).
                       super___shared_ptr<ezc3d::DataNS::RotationNS::Rotations,_(__gnu_cxx::_Lock_policy)2>
                       ._M_ptr,__fd,__buf,__n);
    return sVar1;
  }
  if (in_R8D == 0) {
    this_00 = (this->_points).
              super___shared_ptr<ezc3d::DataNS::Points3dNS::Points,_(__gnu_cxx::_Lock_policy)2>.
              _M_ptr;
    __n_00 = __n;
    std::vector<double,_std::allocator<double>_>::vector
              ((vector<double,_std::allocator<double>_> *)&local_40,
               (vector<double,_std::allocator<double>_> *)__buf);
    Points3dNS::Points::write(this_00,__fd,&local_40,__n_00);
    std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base(&local_40);
    this_01 = (this->_analogs).
              super___shared_ptr<ezc3d::DataNS::AnalogsNS::Analogs,_(__gnu_cxx::_Lock_policy)2>.
              _M_ptr;
    std::vector<double,_std::allocator<double>_>::vector
              ((vector<double,_std::allocator<double>_> *)&_Stack_58,
               (vector<double,_std::allocator<double>_> *)__n);
    AnalogsNS::Analogs::write(this_01,__fd,&_Stack_58,__n_00);
    std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base(&_Stack_58);
    return extraout_RAX;
  }
  this_02 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error(this_02,"Data type not implemented yet");
  __cxa_throw(this_02,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void ezc3d::DataNS::Frame::write(std::fstream &f,
                                 std::vector<double> pointScaleFactor,
                                 std::vector<double> analogScaleFactors,
                                 int dataTypeToWrite) const {
  if (dataTypeToWrite == 0) { // Points and analogs
    points().write(f, pointScaleFactor);
    analogs().write(f, analogScaleFactors);
  } else if (dataTypeToWrite == 1) { // Rotations
    rotations().write(f);
  } else {
    throw std::runtime_error("Data type not implemented yet");
  }
}